

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  undefined1 auVar5 [32];
  uint uVar6;
  bool bVar7;
  __m256i c;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar10;
  __m256i *palVar11;
  __m256i *b_00;
  int iVar12;
  __m256i *ptr;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  __m256i *palVar20;
  undefined1 auVar21 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 auVar22 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_striped_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_striped_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_striped_profile_avx2_256_32_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sw_striped_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_striped_profile_avx2_256_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_striped_profile_avx2_256_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_striped_profile_avx2_256_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_striped_profile_avx2_256_32_cold_1();
        }
        else {
          iVar12 = 0x7ffffffe - ppVar4->max;
          result = parasail_result_new();
          if (result != (parasail_result_t *)0x0) {
            uVar14 = (ulong)uVar2 + 7 >> 3;
            result->flag = result->flag | 0x8400804;
            b = parasail_memalign___m256i(0x20,uVar14);
            palVar10 = parasail_memalign___m256i(0x20,uVar14);
            palVar11 = parasail_memalign___m256i(0x20,uVar14);
            b_00 = parasail_memalign___m256i(0x20,uVar14);
            if ((b_00 != (__m256i *)0x0 && palVar11 != (__m256i *)0x0) &&
                (palVar10 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
              alVar1[1] = (longlong)result;
              alVar1[0] = in_stack_ffffffffffffff38;
              alVar1[2] = (longlong)s2;
              alVar1[3]._0_4_ = in_stack_ffffffffffffff50;
              alVar1[3]._4_4_ = iVar12;
              parasail_memset___m256i(b,alVar1,uVar14);
              c[1] = (longlong)result;
              c[0] = in_stack_ffffffffffffff38;
              c[2] = (longlong)s2;
              c[3]._0_4_ = in_stack_ffffffffffffff50;
              c[3]._4_4_ = iVar12;
              parasail_memset___m256i(b_00,c,uVar14);
              auVar8._4_4_ = gap;
              auVar8._0_4_ = gap;
              auVar8._8_4_ = gap;
              auVar8._12_4_ = gap;
              auVar8._16_4_ = gap;
              auVar8._20_4_ = gap;
              auVar8._24_4_ = gap;
              auVar8._28_4_ = gap;
              auVar9._4_4_ = open;
              auVar9._0_4_ = open;
              auVar9._8_4_ = open;
              auVar9._12_4_ = open;
              auVar9._16_4_ = open;
              auVar9._20_4_ = open;
              auVar9._24_4_ = open;
              auVar9._28_4_ = open;
              uVar19 = 0;
              uVar6 = (uint)uVar14;
              iVar13 = -0x40000000;
              auVar21._8_4_ = 0xc0000000;
              auVar21._0_8_ = 0xc0000000c0000000;
              auVar21._12_4_ = 0xc0000000;
              auVar21._16_4_ = 0xc0000000;
              auVar21._20_4_ = 0xc0000000;
              auVar21._24_4_ = 0xc0000000;
              auVar21._28_4_ = 0xc0000000;
              auVar22 = ZEXT3264(auVar21);
              uVar17 = 0;
              auVar23 = ZEXT3264(auVar21);
              do {
                ptr = b;
                iVar15 = ppVar4->mapper[(byte)s2[uVar17]];
                palVar20 = palVar11;
                b = palVar10;
                if ((int)uVar19 == (int)uVar17 + -2) {
                  palVar20 = palVar10;
                  b = palVar11;
                }
                alVar1 = ptr[uVar6 - 1];
                auVar21 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                auVar21 = vpalignr_avx2((undefined1  [32])alVar1,auVar21,0xc);
                lVar16 = 0;
                auVar24 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar25 = vpaddd_avx2(auVar21,*(undefined1 (*) [32])
                                                 ((long)pvVar3 +
                                                 lVar16 + uVar14 * (long)iVar15 * 0x20));
                  auVar21 = *(undefined1 (*) [32])((long)*b_00 + lVar16);
                  auVar5 = vpmaxsd_avx2(auVar21,auVar24._0_32_);
                  auVar25 = vpmaxsd_avx2(auVar25,auVar5);
                  auVar25 = vpmaxsd_avx2(auVar25,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  *(undefined1 (*) [32])((long)*b + lVar16) = auVar25;
                  auVar5 = vpmaxsd_avx2(auVar25,auVar23._0_32_);
                  auVar23 = ZEXT3264(auVar5);
                  auVar25 = vpsubd_avx2(auVar25,auVar9);
                  auVar21 = vpsubd_avx2(auVar21,auVar8);
                  auVar21 = vpmaxsd_avx2(auVar21,auVar25);
                  *(undefined1 (*) [32])((long)*b_00 + lVar16) = auVar21;
                  auVar21 = vpsubd_avx2(auVar24._0_32_,auVar8);
                  auVar21 = vpmaxsd_avx2(auVar21,auVar25);
                  auVar24 = ZEXT3264(auVar21);
                  auVar21 = *(undefined1 (*) [32])((long)*ptr + lVar16);
                  lVar16 = lVar16 + 0x20;
                } while (uVar14 << 5 != lVar16);
                iVar15 = 0;
                do {
                  auVar25 = auVar24._0_32_;
                  auVar21 = vperm2i128_avx2(auVar25,auVar25,8);
                  auVar21 = vpalignr_avx2(auVar25,auVar21,0xc);
                  auVar24 = ZEXT3264(auVar21);
                  lVar16 = 0;
                  do {
                    auVar21 = vpmaxsd_avx2(auVar24._0_32_,*(undefined1 (*) [32])((long)*b + lVar16))
                    ;
                    *(undefined1 (*) [32])((long)*b + lVar16) = auVar21;
                    auVar25 = vpmaxsd_avx2(auVar21,auVar23._0_32_);
                    auVar23 = ZEXT3264(auVar25);
                    auVar21 = vpsubd_avx2(auVar21,auVar9);
                    auVar5 = vpsubd_avx2(auVar24._0_32_,auVar8);
                    auVar24 = ZEXT3264(auVar5);
                    auVar21 = vpcmpgtd_avx2(auVar5,auVar21);
                    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar21 >> 0x7f,0) == '\0') &&
                          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar21 >> 0xbf,0) == '\0') &&
                        (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar21[0x1f]) goto LAB_0074e1a0;
                    lVar16 = lVar16 + 0x20;
                  } while (uVar14 << 5 != lVar16);
                  iVar15 = iVar15 + 1;
                } while (iVar15 != 8);
LAB_0074e1a0:
                auVar21 = vpcmpgtd_avx2(auVar25,auVar22._0_32_);
                bVar7 = true;
                if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar21 >> 0x7f,0) != '\0') ||
                      (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar21 >> 0xbf,0) != '\0') ||
                    (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar21[0x1f] < '\0') {
                  auVar21 = vpermq_avx2(auVar25,0x44);
                  auVar21 = vpmaxsd_avx2(auVar25,auVar21);
                  auVar25 = vpslldq_avx2(auVar21,8);
                  auVar21 = vpmaxsd_avx2(auVar21,auVar25);
                  auVar25 = vpslldq_avx2(auVar21,4);
                  auVar21 = vpmaxsd_avx2(auVar21,auVar25);
                  iVar13 = auVar21._28_4_;
                  if (iVar12 < iVar13) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    bVar7 = false;
                  }
                  else {
                    auVar25._8_4_ = 7;
                    auVar25._0_8_ = 0x700000007;
                    auVar25._12_4_ = 7;
                    auVar25._16_4_ = 7;
                    auVar25._20_4_ = 7;
                    auVar25._24_4_ = 7;
                    auVar25._28_4_ = 7;
                    auVar21 = vpermd_avx2(auVar25,auVar21);
                    auVar22 = ZEXT3264(auVar21);
                    uVar19 = uVar17 & 0xffffffff;
                  }
                }
                iVar18 = (int)uVar19;
                iVar15 = (int)uVar17;
                if ((!bVar7) ||
                   (uVar17 = uVar17 + 1, palVar10 = ptr, palVar11 = palVar20, iVar15 = s2Len,
                   uVar17 == (uint)s2Len)) {
                  if (iVar13 == 0x7fffffff) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                  iVar12 = parasail_result_is_saturated(result);
                  palVar10 = palVar20;
                  if (iVar12 == 0) {
                    palVar11 = ptr;
                    if (iVar18 == iVar15 + -2) {
                      palVar10 = ptr;
                      palVar11 = palVar20;
                    }
                    if (iVar18 == iVar15 + -1) {
                      palVar10 = b;
                      b = palVar20;
                      palVar11 = ptr;
                    }
                    ptr = palVar11;
                    iVar12 = uVar2 - 1;
                    if (((ulong)uVar2 + 7 & 0x7ffffff8) != 0) {
                      uVar14 = 0;
                      do {
                        if ((*(int *)((long)*palVar10 + uVar14 * 4) == iVar13) &&
                           (iVar15 = ((uint)uVar14 & 7) * uVar6 + ((uint)(uVar14 >> 3) & 0x1fffffff)
                           , iVar15 < iVar12)) {
                          iVar12 = iVar15;
                        }
                        uVar14 = uVar14 + 1;
                      } while ((uVar6 & 0xfffffff) << 3 != (int)uVar14);
                    }
                  }
                  else {
                    iVar18 = 0;
                    iVar13 = 0x7fffffff;
                    iVar12 = 0;
                  }
                  result->score = iVar13;
                  result->end_query = iVar12;
                  result->end_ref = iVar18;
                  parasail_free(b_00);
                  parasail_free(palVar10);
                  parasail_free(ptr);
                  parasail_free(b);
                  return result;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int32_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi32(vH, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi32(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi32(vH, vGapO);
            vE = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vH = _mm256_sub_epi32(vH, vGapO);
                vF = _mm256_sub_epi32(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm256_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}